

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiTests.cpp
# Opt level: O3

void vkt::wsi::anon_unknown_1::createWsiTests(TestCaseGroup *apiTests)

{
  char *__s;
  TestNode *node;
  Type wsiType;
  char *__end;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  wsiType = TYPE_XLIB;
  do {
    __s = ::vk::wsi::getName(wsiType);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
    node = &createTestGroup<vk::wsi::Type>
                      ((apiTests->super_TestNode).m_testCtx,&local_50,&local_70,
                       createTypeSpecificTests,wsiType)->super_TestNode;
    tcu::TestNode::addChild(&apiTests->super_TestNode,node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    wsiType = wsiType + TYPE_XCB;
  } while (wsiType != TYPE_LAST);
  return;
}

Assistant:

void createWsiTests (tcu::TestCaseGroup* apiTests)
{
	for (int typeNdx = 0; typeNdx < vk::wsi::TYPE_LAST; ++typeNdx)
	{
		const vk::wsi::Type	wsiType	= (vk::wsi::Type)typeNdx;

		addTestGroup(apiTests, getName(wsiType), "", createTypeSpecificTests, wsiType);
	}
}